

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

string * cmdline::detail::readable_typename<bool>(void)

{
  char *__ptr;
  string *ret;
  string *in_RDI;
  int status;
  allocator local_36;
  allocator local_35;
  undefined4 local_34;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string((string *)local_30,_VTT + (*_VTT == '*'),&local_36);
  local_34 = 0;
  __ptr = (char *)__cxa_demangle(local_30[0],0,0);
  std::__cxx11::string::string((string *)in_RDI,__ptr,&local_35);
  free(__ptr);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string
            readable_typename()
            {
                return demangle(typeid(T).name());
            }